

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::init
          (MultisampleRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  deUint32 *pdVar1;
  RenderTarget RVar2;
  char *pcVar3;
  RenderContext *pRVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  uint uVar8;
  int extraout_EAX;
  undefined4 extraout_var;
  char *__s;
  mapped_type *pmVar9;
  NotSupportedError *pNVar10;
  ShaderProgram *pSVar11;
  RenderTarget *pRVar12;
  TestLog *pTVar13;
  long *plVar14;
  TestError *pTVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined4 uVar17;
  uint uVar18;
  EVP_PKEY_CTX *ctx_00;
  long lVar19;
  long lVar20;
  deInt32 queriedSampleCount;
  deInt32 maxRboSamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  uint local_2bc;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  string local_268;
  string local_248;
  ShaderProgram *local_228;
  string local_220;
  undefined1 local_200 [8];
  pointer local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_170;
  undefined1 local_150 [208];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar6);
  local_2bc = 0xffffffff;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar5 | GLSL_VERSION_310_ES);
  local_200 = (undefined1  [8])&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"GLSL_VERSION_DECL","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)local_200);
  pcVar3 = (char *)pmVar9->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar3,(ulong)__s);
  if (local_200 != (undefined1  [8])&local_1f0) {
    operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
  }
  RVar2 = this->m_renderTarget;
  if (RVar2 == TARGET_DEFAULT) {
    pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
    value = &this->m_renderSize;
    if ((pRVar12->m_width < this->m_renderSize) ||
       (pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context),
       pRVar12->m_height < *value)) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_248,value);
      std::operator+(&local_268,"Test requires render target with size ",&local_248);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_290._0_8_ = *plVar14;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._0_8_ == paVar16) {
        local_280._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_280._8_8_ = plVar14[3];
        local_290._0_8_ = &local_280;
      }
      else {
        local_280._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_290._8_8_ = plVar14[1];
      *plVar14 = (long)paVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      de::toString<int>(&local_220,value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                     &local_220);
      plVar14 = (long *)std::__cxx11::string::append(local_2b8);
      local_200 = (undefined1  [8])*plVar14;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if (local_200 == (undefined1  [8])paVar16) {
        local_1f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_1f0._8_8_ = plVar14[3];
        local_200 = (undefined1  [8])&local_1f0;
      }
      else {
        local_1f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_1f8 = (pointer)plVar14[1];
      *plVar14 = (long)paVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_200);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (RVar2 == TARGET_TEXTURE) {
    local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
    (**(code **)(lVar19 + 0x880))(0x9100,0x8058,0x80a9,1);
    if ((int)local_2b8._0_4_ < this->m_numRequestedSamples) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Sample count not supported","");
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_200);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (RVar2 == TARGET_RENDERBUFFER) {
    local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
    (**(code **)(lVar19 + 0x880))(0x8d41,0x8058,0x80a9,1);
    if ((int)local_2b8._0_4_ < this->m_numRequestedSamples) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Sample count not supported","");
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_200);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (**(code **)(lVar19 + 0x6c8))(1,&this->m_buffer);
  dVar7 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar7,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x91);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])(this);
  dVar7 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar7,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x94);
  (**(code **)(lVar19 + 0x708))(1,&this->m_renderVao);
  uVar8 = (**(code **)(lVar19 + 0x800))();
  ctx_00 = (EVP_PKEY_CTX *)(ulong)uVar8;
  glu::checkError(uVar8,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x97);
  if (init()::fullscreenQuad == '\0') {
    init(ctx_00);
  }
  (**(code **)(lVar19 + 0x6c8))(1,&this->m_resolveBuffer);
  (**(code **)(lVar19 + 0x40))(0x8892,this->m_resolveBuffer);
  (**(code **)(lVar19 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
  dVar7 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar7,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0xa6);
  if (this->m_renderTarget == TARGET_RENDERBUFFER) {
    pdVar1 = &this->m_fboRbo;
    (**(code **)(lVar19 + 0x6e8))(1,pdVar1);
    (**(code **)(lVar19 + 0xa0))(0x8d41,*pdVar1);
    (**(code **)(lVar19 + 0x1240))
              (0x8d41,this->m_numRequestedSamples,0x8058,this->m_renderSize,this->m_renderSize);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe3);
    (**(code **)(lVar19 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar19 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lVar19 + 0x688))(0x8d40,0x8ce0,0x8d41,*pdVar1);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe8);
    iVar6 = (**(code **)(lVar19 + 0x170))(0x8d40);
    if (iVar6 != 0x8cd5) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"fbo not complete","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar19 + 0xa30))(0x8d41,0x8cab,&local_2bc);
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Asked for ",10);
    std::ostream::operator<<((ostringstream *)&local_1f8,this->m_numRequestedSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," samples, got ",0xe);
    std::ostream::operator<<((ostringstream *)&local_1f8,local_2bc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," samples.",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    if ((int)local_2bc < this->m_numRequestedSamples) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Got less renderbuffer samples samples than asked for","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (this->m_renderTarget == TARGET_TEXTURE) {
    uVar17 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      uVar17 = 0xde1;
    }
    (**(code **)(lVar19 + 0x708))(1,&this->m_resolveVao);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen vao",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xb1);
    pdVar1 = &this->m_fboTexture;
    (**(code **)(lVar19 + 0x6f8))(1,pdVar1);
    (**(code **)(lVar19 + 0xb8))(uVar17,*pdVar1);
    iVar6 = this->m_renderSize;
    if (this->m_numRequestedSamples == 0) {
      (**(code **)(lVar19 + 0x1380))(uVar17,1,0x8058,iVar6,iVar6);
      (**(code **)(lVar19 + 0x1360))(uVar17,0x2800,0x2600);
      (**(code **)(lVar19 + 0x1360))(uVar17,0x2801,0x2600);
    }
    else {
      (**(code **)(lVar19 + 0x1390))(uVar17,this->m_numRequestedSamples,0x8058,iVar6,iVar6,0);
    }
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xbd);
    (**(code **)(lVar19 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar19 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lVar19 + 0x6a0))(0x8d40,0x8ce0,uVar17,*pdVar1,0);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xc2);
    iVar6 = (**(code **)(lVar19 + 0x170))(0x8d40);
    if (iVar6 != 0x8cd5) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"fbo not complete","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_numRequestedSamples != 0) {
      (**(code **)(lVar19 + 0xab0))(0x9100,0,0x9106,&local_2bc);
      local_200 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Asked for ",10);
      std::ostream::operator<<((ostringstream *)&local_1f8,this->m_numRequestedSamples);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," samples, got ",0xe)
      ;
      std::ostream::operator<<((ostringstream *)&local_1f8,local_2bc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," samples.",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      if ((int)local_2bc < this->m_numRequestedSamples) {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        local_200 = (undefined1  [8])&local_1f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"Got less texture samples than asked for","");
        tcu::TestError::TestError(pTVar15,(string *)local_200);
        __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    pSVar11 = (ShaderProgram *)operator_new(0xd0);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_150[0x10] = 0;
    local_150._17_8_ = 0;
    local_150._0_8_ = (pointer)0x0;
    local_150[8] = 0;
    local_150._9_7_ = 0;
    memset(local_200,0,0xac);
    local_228 = pSVar11;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}"
               ,"");
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_248,&local_220);
    tcu::StringTemplate::specialize
              (&local_268,(StringTemplate *)&local_248,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_60);
    local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
    local_2b8._8_8_ = local_2a8._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2b8 + 8),local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8)
               );
    genMSSamplerSource_abi_cxx11_(&local_80,this,local_2bc);
    local_290._0_4_ = 1;
    local_290._8_8_ = local_280._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_290 + 8),local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    pSVar11 = local_228;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + (local_290._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_290 + 8)
               );
    glu::ShaderProgram::ShaderProgram(pSVar11,pRVar4,(ProgramSources *)local_200);
    this->m_textureSamplerProgram = pSVar11;
    if ((char *)local_290._8_8_ != local_280._M_local_buf + 8) {
      operator_delete((void *)local_290._8_8_,local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_2b8._8_8_ != local_2a8._M_local_buf + 8) {
      operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_150);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_170);
    lVar20 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + lVar20));
      lVar20 = lVar20 + -0x18;
    } while (lVar20 != -0x18);
    if ((this->m_textureSamplerProgram->m_program).m_info.linkOk == false) {
      pTVar13 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2b8._0_8_ = &local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"SamplerShader","");
      local_290._0_8_ = &local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Sampler shader","");
      tcu::LogSection::LogSection((LogSection *)local_200,(string *)local_2b8,(string *)local_290);
      tcu::TestLog::startSection(pTVar13,(char *)local_200,local_1e0._M_p);
      pTVar13 = glu::operator<<(pTVar13,this->m_textureSamplerProgram);
      tcu::TestLog::endSection(pTVar13);
      tcu::LogSection::~LogSection((LogSection *)local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._0_8_ != &local_280) {
        operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ != &local_2a8) {
        operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
      }
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"could not build program","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_renderTarget != TARGET_DEFAULT) {
    pdVar1 = &this->m_resolveFboTexture;
    (**(code **)(lVar19 + 0x6f8))(1,pdVar1);
    (**(code **)(lVar19 + 0xb8))(0xde1,*pdVar1);
    (**(code **)(lVar19 + 0x1380))(0xde1,1,0x8058,this->m_renderSize,this->m_renderSize);
    (**(code **)(lVar19 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar19 + 0x1360))(0xde1,0x2801,0x2600);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xfe);
    (**(code **)(lVar19 + 0x6d0))(1,&this->m_resolveFbo);
    (**(code **)(lVar19 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lVar19 + 0x6a0))(0x8d40,0x8ce0,0xde1,*pdVar1,0);
    dVar7 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar7,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x103);
    iVar6 = (**(code **)(lVar19 + 0x170))(0x8d40);
    if (iVar6 != 0x8cd5) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"resolve fbo not complete","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  RVar2 = this->m_renderTarget;
  if (RVar2 == TARGET_DEFAULT) {
    pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
    uVar8 = pRVar12->m_numSamples;
  }
  else {
    uVar8 = local_2bc;
    if (RVar2 != TARGET_RENDERBUFFER) {
      uVar18 = 0xffffffff;
      if (RVar2 != TARGET_TEXTURE) goto LAB_0155acea;
      if (this->m_numRequestedSamples == 0) {
        uVar18 = 1;
        goto LAB_0155acea;
      }
    }
  }
  uVar18 = 1;
  if (1 < (int)uVar8) {
    uVar18 = uVar8;
  }
LAB_0155acea:
  this->m_numTargetSamples = uVar18;
  if (this->m_perIterationShader == false) {
    pSVar11 = (ShaderProgram *)operator_new(0xd0);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_150[0x10] = 0;
    local_150._17_8_ = 0;
    local_150._0_8_ = (pointer)0x0;
    local_150[8] = 0;
    local_150._9_7_ = 0;
    memset(local_200,0,0xac);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_268,this,(ulong)uVar18);
    local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
    local_2b8._8_8_ = local_2a8._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2b8 + 8),local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8)
               );
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_248,this,(ulong)(uint)this->m_numTargetSamples);
    local_290._0_4_ = 1;
    local_290._8_8_ = local_280._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_290 + 8),local_248._M_dataplus._M_p,
               local_248._M_dataplus._M_p + local_248._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + (local_290._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_290 + 8)
               );
    glu::ShaderProgram::ShaderProgram(pSVar11,pRVar4,(ProgramSources *)local_200);
    this->m_program = pSVar11;
    if ((char *)local_290._8_8_ != local_280._M_local_buf + 8) {
      operator_delete((void *)local_290._8_8_,local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_2b8._8_8_ != local_2a8._M_local_buf + 8) {
      operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_150);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_170);
    lVar19 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_200 + lVar19));
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != -0x18);
    pTVar13 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2b8._0_8_ = &local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"RenderShader","");
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Render shader","");
    tcu::LogSection::LogSection((LogSection *)local_200,(string *)local_2b8,(string *)local_290);
    tcu::TestLog::startSection(pTVar13,(char *)local_200,local_1e0._M_p);
    pTVar13 = glu::operator<<(pTVar13,this->m_program);
    tcu::TestLog::endSection(pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,(ulong)(local_1d0[0]._M_allocated_capacity + 1));
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ != &local_280) {
      operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ != &local_2a8) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
    }
    if ((this->m_program->m_program).m_info.linkOk == false) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"could not build program","");
      tcu::TestError::TestError(pTVar15,(string *)local_200);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return extraout_EAX;
}

Assistant:

void MultisampleRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	deInt32					queriedSampleCount	= -1;
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>		args;

	args["GLSL_VERSION_DECL"] = supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	// requirements

	switch (m_renderTarget)
	{
		case TARGET_DEFAULT:
		{
			if (m_context.getRenderTarget().getWidth() < m_renderSize || m_context.getRenderTarget().getHeight() < m_renderSize)
				throw tcu::NotSupportedError("Test requires render target with size " + de::toString(m_renderSize) + "x" + de::toString(m_renderSize) + " or greater");
			break;
		}

		case TARGET_TEXTURE:
		{
			deInt32 maxTextureSamples = 0;
			gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_SAMPLES, 1, &maxTextureSamples);

			if (m_numRequestedSamples > maxTextureSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		case TARGET_RENDERBUFFER:
		{
			deInt32 maxRboSamples = 0;
			gl.getInternalformativ(GL_RENDERBUFFER, GL_RGBA8, GL_SAMPLES, 1, &maxRboSamples);

			if (m_numRequestedSamples > maxRboSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		default:
			DE_ASSERT(false);
	}

	// resources

	{
		gl.genBuffers(1, &m_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		setupRenderData();
		GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");

		gl.genVertexArrays(1, &m_renderVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		// buffer for MSAA texture resolving
		{
			static const tcu::Vec4 fullscreenQuad[] =
			{
				tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			};

			gl.genBuffers(1, &m_resolveBuffer);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");
		}
	}

	// msaa targets

	if (m_renderTarget == TARGET_TEXTURE)
	{
		const deUint32 textureTarget = (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);

		gl.genVertexArrays(1, &m_resolveVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		gl.genTextures(1, &m_fboTexture);
		gl.bindTexture(textureTarget, m_fboTexture);
		if (m_numRequestedSamples == 0)
		{
			gl.texStorage2D(textureTarget, 1, GL_RGBA8, m_renderSize, m_renderSize);
			gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
		else
			gl.texStorage2DMultisample(textureTarget, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureTarget, m_fboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		if (m_numRequestedSamples != 0)
		{
			// for shader
			gl.getTexLevelParameteriv(GL_TEXTURE_2D_MULTISAMPLE, 0, GL_TEXTURE_SAMPLES, &queriedSampleCount);

			// logging
			m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

			// sanity
			if (queriedSampleCount < m_numRequestedSamples)
				throw tcu::TestError("Got less texture samples than asked for");
		}

		// texture sampler shader
		m_textureSamplerProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(tcu::StringTemplate(s_vertexSource).specialize(args))
			<< glu::FragmentSource(genMSSamplerSource(queriedSampleCount)));
		if (!m_textureSamplerProgram->isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Section("SamplerShader", "Sampler shader") << *m_textureSamplerProgram << tcu::TestLog::EndSection;
			throw tcu::TestError("could not build program");
		}
	}
	else if (m_renderTarget == TARGET_RENDERBUFFER)
	{
		gl.genRenderbuffers(1, &m_fboRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_fboRbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen rbo");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_fboRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		// logging
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &queriedSampleCount);
		m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

		// sanity
		if (queriedSampleCount < m_numRequestedSamples)
			throw tcu::TestError("Got less renderbuffer samples samples than asked for");
	}

	// fbo for resolving the multisample fbo
	if (m_renderTarget != TARGET_DEFAULT)
	{
		gl.genTextures(1, &m_resolveFboTexture);
		gl.bindTexture(GL_TEXTURE_2D, m_resolveFboTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, m_renderSize, m_renderSize);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_resolveFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_resolveFboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("resolve fbo not complete");
	}

	// create verifier shader and set targetSampleCount

	{
		int realSampleCount = -1;

		if (m_renderTarget == TARGET_TEXTURE)
		{
			if (m_numRequestedSamples == 0)
				realSampleCount = 1; // non msaa texture
			else
				realSampleCount = de::max(1, queriedSampleCount); // msaa texture
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			realSampleCount = de::max(1, queriedSampleCount); // msaa rbo
		}
		else if (m_renderTarget == TARGET_DEFAULT)
		{
			realSampleCount = de::max(1, m_context.getRenderTarget().getNumSamples());
		}
		else
			DE_ASSERT(DE_FALSE);

		// is set and is valid
		DE_ASSERT(realSampleCount != -1);
		DE_ASSERT(realSampleCount != 0);
		m_numTargetSamples = realSampleCount;
	}

	if (!m_perIterationShader)
	{
		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource(m_numTargetSamples)) << glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}
}